

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode Curl_dupset(Curl_easy *dst,Curl_easy *src)

{
  char **__s;
  char *pcVar1;
  size_t length;
  CURLcode CVar2;
  long lVar3;
  
  memcpy(&dst->set,&src->set,0x6b8);
  __s = (dst->set).str;
  lVar3 = 0;
  memset(__s,0,0x1c0);
  do {
    pcVar1 = (src->set).str[lVar3];
    (*Curl_cfree)(__s[lVar3]);
    __s[lVar3] = (char *)0x0;
    if (pcVar1 != (char *)0x0) {
      pcVar1 = (*Curl_cstrdup)(pcVar1);
      if (pcVar1 == (char *)0x0) goto LAB_004f8679;
      __s[lVar3] = pcVar1;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x36);
  lVar3 = (src->set).postfieldsize;
  CVar2 = CURLE_OK;
  if ((lVar3 != 0) && (pcVar1 = (src->set).str[0x37], CVar2 = CURLE_OK, pcVar1 != (char *)0x0)) {
    length = curlx_sotouz(lVar3);
    pcVar1 = (char *)Curl_memdup(pcVar1,length);
    (dst->set).str[0x37] = pcVar1;
    if (pcVar1 == (char *)0x0) {
LAB_004f8679:
      CVar2 = CURLE_OUT_OF_MEMORY;
    }
    else {
      (dst->set).postfields = pcVar1;
    }
  }
  return CVar2;
}

Assistant:

CURLcode Curl_dupset(struct Curl_easy *dst, struct Curl_easy *src)
{
  CURLcode result = CURLE_OK;
  enum dupstring i;

  /* Copy src->set into dst->set first, then deal with the strings
     afterwards */
  dst->set = src->set;

  /* clear all string pointers first */
  memset(dst->set.str, 0, STRING_LAST * sizeof(char *));

  /* duplicate all strings */
  for(i=(enum dupstring)0; i< STRING_LASTZEROTERMINATED; i++) {
    result = setstropt(&dst->set.str[i], src->set.str[i]);
    if(result)
      return result;
  }

  /* duplicate memory areas pointed to */
  i = STRING_COPYPOSTFIELDS;
  if(src->set.postfieldsize && src->set.str[i]) {
    /* postfieldsize is curl_off_t, Curl_memdup() takes a size_t ... */
    dst->set.str[i] = Curl_memdup(src->set.str[i],
                                  curlx_sotouz(src->set.postfieldsize));
    if(!dst->set.str[i])
      return CURLE_OUT_OF_MEMORY;
    /* point to the new copy */
    dst->set.postfields = dst->set.str[i];
  }

  return CURLE_OK;
}